

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

_Bool get_separator(HttpProxyNegotiator *s,char sep)

{
  strbuf *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  psVar1 = s->header;
  uVar3 = s->header_pos;
  uVar2 = psVar1->len;
  if (uVar3 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)psVar1->s[uVar3]) ||
         ((0x100000600U >> ((ulong)(byte)psVar1->s[uVar3] & 0x3f) & 1) == 0)) goto LAB_0010acd8;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  else {
LAB_0010acd8:
    if ((uVar3 != uVar2) && (psVar1->s[uVar3] == sep)) {
      s->header_pos = uVar3 + 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool get_separator(HttpProxyNegotiator *s, char sep)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (s->header->s[pos] != sep)
        return false;

    s->header_pos = ++pos;
    return true;
}